

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

void __thiscall
node::anon_unknown_2::ChainImpl::getPackageLimits
          (ChainImpl *this,uint *limit_ancestor_count,uint *limit_descendant_count)

{
  long lVar1;
  CTxMemPool *pCVar2;
  uint uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = (this->m_node->mempool)._M_t.
           super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
           super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  if (pCVar2 == (CTxMemPool *)0x0) {
    *limit_ancestor_count = 0x19;
    uVar3 = 0x19;
  }
  else {
    *limit_ancestor_count = (uint)(pCVar2->m_opts).limits.ancestor_count;
    uVar3 = *(uint *)((long)&(pCVar2->m_opts).limits + 0x10);
  }
  *limit_descendant_count = uVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void getPackageLimits(unsigned int& limit_ancestor_count, unsigned int& limit_descendant_count) override
    {
        const CTxMemPool::Limits default_limits{};

        const CTxMemPool::Limits& limits{m_node.mempool ? m_node.mempool->m_opts.limits : default_limits};

        limit_ancestor_count = limits.ancestor_count;
        limit_descendant_count = limits.descendant_count;
    }